

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

bool fmt::v11::detail::check_char_specs(format_specs *specs)

{
  presentation_type pVar1;
  bool bVar2;
  align aVar3;
  int iVar4;
  size_t *in_RCX;
  uchar *sig;
  EVP_PKEY_CTX *in_RSI;
  basic_specs *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  presentation_type type;
  char *unaff_retaddr;
  
  pVar1 = basic_specs::type(in_RDI);
  if (((pVar1 != none) && (pVar1 != chr)) && (pVar1 != debug)) {
    return false;
  }
  aVar3 = basic_specs::align(in_RDI);
  if (((aVar3 != numeric) &&
      (iVar4 = basic_specs::sign(in_RDI,in_RSI,sig,in_RCX,in_R8,in_R9), iVar4 == 0)) &&
     (bVar2 = basic_specs::alt(in_RDI), !bVar2)) {
    return true;
  }
  report_error(unaff_retaddr);
}

Assistant:

FMT_CONSTEXPR inline auto check_char_specs(const format_specs& specs) -> bool {
  auto type = specs.type();
  if (type != presentation_type::none && type != presentation_type::chr &&
      type != presentation_type::debug) {
    return false;
  }
  if (specs.align() == align::numeric || specs.sign() != sign::none ||
      specs.alt()) {
    report_error("invalid format specifier for char");
  }
  return true;
}